

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

bool __thiscall
Clasp::DefaultUnfoundedCheck::MinimalityCheck::partialCheck(MinimalityCheck *this,uint32 level)

{
  bool local_19;
  uint32 level_local;
  MinimalityCheck *this_local;
  
  if (level < this->low) {
    this->next = this->next - (this->low - level);
    this->low = level;
  }
  local_19 = true;
  if (this->next != 0) {
    local_19 = this->next == level;
  }
  return local_19;
}

Assistant:

bool DefaultUnfoundedCheck::MinimalityCheck::partialCheck(uint32 level) {
	if (level < low) {
		next -= (low - level);
		low   = level;
	}
	return !next || next == level;
}